

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crl.c
# Opt level: O0

int x509_get_entries(uchar **p,uchar *end,mbedtls_x509_crl_entry *entry)

{
  uchar *end_00;
  void *pvVar1;
  uchar *end2;
  size_t len2;
  mbedtls_x509_crl_entry *cur_entry;
  size_t entry_len;
  mbedtls_x509_crl_entry *pmStack_28;
  int ret;
  mbedtls_x509_crl_entry *entry_local;
  uchar *end_local;
  uchar **p_local;
  
  if (*p == end) {
    p_local._4_4_ = 0;
  }
  else {
    len2 = (size_t)entry;
    pmStack_28 = entry;
    entry_local = (mbedtls_x509_crl_entry *)end;
    end_local = (uchar *)p;
    p_local._4_4_ = mbedtls_asn1_get_tag(p,end,(size_t *)&cur_entry,0x30);
    if (p_local._4_4_ == 0) {
      entry_local = (mbedtls_x509_crl_entry *)((long)&(cur_entry->raw).tag + *(long *)end_local);
      entry_len._4_4_ = 0;
      while (*(mbedtls_x509_crl_entry **)end_local < entry_local) {
        entry_len._4_4_ =
             mbedtls_asn1_get_tag((uchar **)end_local,(uchar *)entry_local,(size_t *)&end2,0x30);
        if (entry_len._4_4_ != 0) {
          return entry_len._4_4_;
        }
        *(uint *)len2 = (uint)**(byte **)end_local;
        *(undefined8 *)(len2 + 0x10) = *(undefined8 *)end_local;
        *(uchar **)(len2 + 8) = end2;
        end_00 = end2 + *(long *)end_local;
        entry_len._4_4_ =
             mbedtls_x509_get_serial((uchar **)end_local,end_00,(mbedtls_x509_buf *)(len2 + 0x18));
        if (entry_len._4_4_ != 0) {
          return entry_len._4_4_;
        }
        entry_len._4_4_ =
             mbedtls_x509_get_time((uchar **)end_local,end_00,(mbedtls_x509_time *)(len2 + 0x30));
        if (entry_len._4_4_ != 0) {
          return entry_len._4_4_;
        }
        entry_len._4_4_ =
             x509_get_crl_entry_ext((uchar **)end_local,end_00,(mbedtls_x509_buf *)(len2 + 0x48));
        if (entry_len._4_4_ != 0) {
          return entry_len._4_4_;
        }
        if (*(mbedtls_x509_crl_entry **)end_local < entry_local) {
          pvVar1 = calloc(1,0x68);
          *(void **)(len2 + 0x60) = pvVar1;
          if (*(long *)(len2 + 0x60) == 0) {
            return -0x2880;
          }
          len2 = *(size_t *)(len2 + 0x60);
        }
      }
      p_local._4_4_ = 0;
    }
    else if (p_local._4_4_ == -0x62) {
      p_local._4_4_ = 0;
    }
  }
  return p_local._4_4_;
}

Assistant:

static int x509_get_entries( unsigned char **p,
                             const unsigned char *end,
                             mbedtls_x509_crl_entry *entry )
{
    int ret;
    size_t entry_len;
    mbedtls_x509_crl_entry *cur_entry = entry;

    if( *p == end )
        return( 0 );

    if( ( ret = mbedtls_asn1_get_tag( p, end, &entry_len,
            MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED ) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
            return( 0 );

        return( ret );
    }

    end = *p + entry_len;

    while( *p < end )
    {
        size_t len2;
        const unsigned char *end2;

        if( ( ret = mbedtls_asn1_get_tag( p, end, &len2,
                MBEDTLS_ASN1_SEQUENCE | MBEDTLS_ASN1_CONSTRUCTED ) ) != 0 )
        {
            return( ret );
        }

        cur_entry->raw.tag = **p;
        cur_entry->raw.p = *p;
        cur_entry->raw.len = len2;
        end2 = *p + len2;

        if( ( ret = mbedtls_x509_get_serial( p, end2, &cur_entry->serial ) ) != 0 )
            return( ret );

        if( ( ret = mbedtls_x509_get_time( p, end2,
                                   &cur_entry->revocation_date ) ) != 0 )
            return( ret );

        if( ( ret = x509_get_crl_entry_ext( p, end2,
                                            &cur_entry->entry_ext ) ) != 0 )
            return( ret );

        if( *p < end )
        {
            cur_entry->next = mbedtls_calloc( 1, sizeof( mbedtls_x509_crl_entry ) );

            if( cur_entry->next == NULL )
                return( MBEDTLS_ERR_X509_ALLOC_FAILED );

            cur_entry = cur_entry->next;
        }
    }

    return( 0 );
}